

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clEnqueueAcquireExternalMemObjectsKHR
                 (cl_command_queue command_queue,cl_uint num_mem_objects,cl_mem *mem_objects,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  bool bVar2;
  _func_cl_int_cl_command_queue_cl_uint_cl_mem_ptr_cl_uint_cl_event_ptr_cl_event_ptr *p_Var3;
  CLIntercept *this;
  cl_int cVar4;
  int iVar5;
  mapped_type *pmVar6;
  uint64_t enqueueCounter;
  time_point tVar7;
  time_point tVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  mapped_type *pmVar11;
  bool bVar12;
  cl_device_id device;
  cl_platform_id platform;
  cl_event local_event;
  time_point local_b0;
  undefined1 local_a0 [32];
  cl_command_queue local_80;
  time_point local_78;
  cl_uint local_6c;
  time_point local_68;
  undefined8 local_60;
  undefined1 local_58 [32];
  cl_event local_38;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  local_a0._0_8_ = (cl_device_id)0x0;
  local_80 = command_queue;
  local_78.__d.__r = (duration)(duration)mem_objects;
  local_6c = num_mem_objects;
  (*(g_pIntercept->m_Dispatch).clGetCommandQueueInfo)(command_queue,0x1091,8,local_a0,(size_t *)0x0)
  ;
  local_58._0_8_ = (key_type)0x0;
  (*(this->m_Dispatch).clGetDeviceInfo)
            ((cl_device_id)local_a0._0_8_,0x1031,8,local_58,(size_t *)0x0);
  pmVar6 = (mapped_type *)&(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = (_Base_ptr)pmVar6;
  for (p_Var10 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 != (_Base_ptr)0x0;
      p_Var10 = (&p_Var10->_M_left)[*(key_type *)(p_Var10 + 1) < (ulong)local_58._0_8_]) {
    if (*(key_type *)(p_Var10 + 1) >= (ulong)local_58._0_8_) {
      p_Var9 = p_Var10;
    }
  }
  p_Var10 = (_Base_ptr)pmVar6;
  if (((mapped_type *)p_Var9 != pmVar6) &&
     (p_Var10 = p_Var9, (ulong)local_58._0_8_ < *(key_type *)(p_Var9 + 1))) {
    p_Var10 = (_Base_ptr)pmVar6;
  }
  if ((mapped_type *)p_Var10 == pmVar6) {
    local_58._0_8_ = (key_type)0x0;
    pmVar6 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_58);
    pmVar11 = pmVar6;
  }
  else {
    pmVar11 = (mapped_type *)&p_Var10[1]._M_parent;
  }
  local_b0.__d.__r._0_4_ = (cl_int)pmVar6;
  p_Var3 = pmVar11->clEnqueueAcquireExternalMemObjectsKHR;
  if (p_Var3 == (_func_cl_int_cl_command_queue_cl_uint_cl_mem_ptr_cl_uint_cl_event_ptr_cl_event_ptr
                 *)0x0) goto LAB_00133694;
  enqueueCounter = CLIntercept::incrementEnqueueCounter(this);
  if (((((this->m_Config).AubCapture == true) &&
       ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
      (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueAcquireExternalMemObjectsKHR",enqueueCounter,(cl_kernel)0x0,0,
               (size_t *)0x0,(size_t *)0x0,local_80);
  }
  local_b0.__d.__r._0_4_ = 0;
  if ((this->m_Config).NullEnqueue == false) {
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingEnter
                (this,"clEnqueueAcquireExternalMemObjectsKHR",enqueueCounter,(cl_kernel)0x0);
    }
    if ((this->m_Config).EventChecking == true) {
      CLIntercept::checkEventList
                (this,"clEnqueueAcquireExternalMemObjectsKHR",num_events_in_wait_list,
                 event_wait_list,event);
    }
    local_38 = (cl_event)0x0;
    if ((((this->m_Config).DevicePerformanceTiming == false) &&
        ((this->m_Config).ITTPerformanceTiming == false)) &&
       (((this->m_Config).ChromePerformanceTiming == false &&
        ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
      local_68.__d.__r = (duration)0;
      local_60 = 0;
    }
    else {
      local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_60 = CONCAT71((int7)((ulong)local_68.__d.__r >> 8),event == (cl_event *)0x0);
      if (event == (cl_event *)0x0) {
        event = &local_38;
      }
    }
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_b0.__d.__r = (duration)0;
    }
    else {
      local_b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    cVar4 = (*pmVar11->clEnqueueAcquireExternalMemObjectsKHR)
                      (local_80,local_6c,(cl_mem *)local_78.__d.__r,num_events_in_wait_list,
                       event_wait_list,event);
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_78.__d.__r = (duration)0;
    }
    else {
      local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_58._0_8_ = (key_type)(local_58 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
        CLIntercept::updateHostTimingStats
                  (this,"clEnqueueAcquireExternalMemObjectsKHR",(string *)local_58,local_b0,local_78
                  );
        if ((key_type)local_58._0_8_ != (key_type)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_);
        }
      }
    }
    if ((((this->m_Config).DevicePerformanceTiming == false) &&
        ((this->m_Config).ITTPerformanceTiming == false)) &&
       ((this->m_Config).ChromePerformanceTiming == false)) {
      if ((event != (cl_event *)0x0) &&
         ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_001337c5:
        bVar2 = false;
        if (enqueueCounter < (this->m_Config).DevicePerformanceTimingMinEnqueue) {
          bVar12 = false;
        }
        else {
          bVar12 = false;
          if (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue) {
            if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
              local_58._0_8_ = local_58 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_58,"clEnqueueAcquireExternalMemObjectsKHR","");
              iVar5 = std::__cxx11::string::compare(local_58);
              bVar12 = iVar5 != 0;
              bVar2 = true;
            }
            else {
              bVar12 = true;
              bVar2 = false;
            }
          }
        }
        if ((bVar2) && ((key_type)local_58._0_8_ != (key_type)(local_58 + 0x10))) {
          operator_delete((void *)local_58._0_8_);
        }
        if (bVar12) {
          local_a0._0_8_ = (cl_device_id)(local_a0 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
          CLIntercept::addTimingEvent
                    (this,"clEnqueueAcquireExternalMemObjectsKHR",enqueueCounter,local_68,
                     (string *)local_a0,local_80,*event);
          if ((cl_device_id)local_a0._0_8_ != (cl_device_id)(local_a0 + 0x10)) {
            operator_delete((void *)local_a0._0_8_);
          }
        }
        if ((char)local_60 != '\0') {
          (*(this->m_Dispatch).clReleaseEvent)(*event);
          goto LAB_001338bf;
        }
      }
    }
    else {
      if (event != (cl_event *)0x0) goto LAB_001337c5;
LAB_001338bf:
      event = (cl_event *)0x0;
    }
    bVar2 = (this->m_Config).ErrorLogging;
    if ((bVar2 == false) && ((this->m_Config).ErrorAssert == false)) {
      if ((cVar4 != 0) && ((this->m_Config).NoErrors != false)) {
LAB_001338ed:
        if (bVar2 != false) {
          CLIntercept::logError(this,"clEnqueueAcquireExternalMemObjectsKHR",cVar4);
        }
        if ((this->m_Config).ErrorAssert == true) {
          raise(5);
        }
        if ((this->m_Config).NoErrors != false) {
          cVar4 = 0;
        }
      }
    }
    else {
      if (cVar4 != 0) goto LAB_001338ed;
      cVar4 = 0;
    }
    if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
       (*event != (cl_event)0x0)) {
      LOCK();
      pCVar1 = &(this->m_ObjectTracker).m_Events;
      (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
           (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingExit
                (this,"clEnqueueAcquireExternalMemObjectsKHR",cVar4,event,(cl_sync_point_khr *)0x0);
    }
    if ((this->m_Config).ChromeCallLogging == true) {
      local_a0._0_8_ = (cl_device_id)(local_a0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
      CLIntercept::chromeCallLoggingExit
                (this,"clEnqueueAcquireExternalMemObjectsKHR",(string *)local_a0,true,enqueueCounter
                 ,local_b0,local_78);
      if ((cl_device_id)local_a0._0_8_ != (cl_device_id)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_);
      }
    }
    local_b0.__d.__r._0_4_ = cVar4;
    if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
       (((this->m_Config).ChromeCallLogging != false ||
        ((this->m_Config).ChromePerformanceTiming == true)))) {
      CLIntercept::addEvent(this,*event,enqueueCounter);
    }
  }
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar7.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart
              (this,"clFinish","clEnqueueAcquireExternalMemObjectsKHR");
    cVar4 = (*(this->m_Dispatch).clFinish)(local_80);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueAcquireExternalMemObjectsKHR",cVar4);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_a0._0_8_ = (cl_device_id)(local_a0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
        CLIntercept::updateHostTimingStats
                  (this,"(finish after enqueue)",(string *)local_a0,tVar7,tVar8);
        if ((cl_device_id)local_a0._0_8_ != (cl_device_id)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_a0._0_8_ = (cl_device_id)(local_a0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",(string *)local_a0,false,0,tVar7,tVar8);
        if ((cl_device_id)local_a0._0_8_ != (cl_device_id)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar7.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_a0._0_8_ = (cl_device_id)(local_a0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
        CLIntercept::updateHostTimingStats
                  (this,"(device timing overhead)",(string *)local_a0,tVar7,tVar8);
        if ((cl_device_id)local_a0._0_8_ != (cl_device_id)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_a0._0_8_ = (cl_device_id)(local_a0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",(string *)local_a0,false,0,tVar7,tVar8);
        if ((cl_device_id)local_a0._0_8_ != (cl_device_id)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(local_80);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)))) {
    CLIntercept::stopAubCapture(this,local_80);
  }
LAB_00133694:
  if (p_Var3 == (_func_cl_int_cl_command_queue_cl_uint_cl_mem_ptr_cl_uint_cl_event_ptr_cl_event_ptr
                 *)0x0) {
    return -0x24;
  }
  return (cl_int)local_b0.__d.__r;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueAcquireExternalMemObjectsKHR(
    cl_command_queue command_queue,
    cl_uint num_mem_objects,
    const cl_mem *mem_objects,
    cl_uint num_events_in_wait_list,
    const cl_event *event_wait_list,
    cl_event *event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_queue);
        if( dispatchX.clEnqueueAcquireExternalMemObjectsKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                CALL_LOGGING_ENTER();
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueAcquireExternalMemObjectsKHR(
                    command_queue,
                    num_mem_objects,
                    mem_objects,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}